

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

Vec_Int_t * Glucose_SolverFromAig2(Gia_Man_t *p,SimpSolver *S)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vCnfIds;
  int i;
  Cnf_Dat_t *pCnf;
  SimpSolver *S_local;
  Gia_Man_t *p_local;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  vCnfIds._4_4_ = 0;
  while( true ) {
    if (p_00->nClauses <= vCnfIds._4_4_) {
      pVVar2 = Vec_IntAllocArrayCopy(p_00->pVarNums,p_00->nVars);
      Cnf_DataFree(p_00);
      return pVVar2;
    }
    iVar1 = glucose_solver_addclause
                      (S,p_00->pClauses[vCnfIds._4_4_],
                       (int)((long)p_00->pClauses[vCnfIds._4_4_ + 1] -
                             (long)p_00->pClauses[vCnfIds._4_4_] >> 2));
    if (iVar1 == 0) break;
    vCnfIds._4_4_ = vCnfIds._4_4_ + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                ,0x2d6,"Vec_Int_t *Glucose_SolverFromAig2(Gia_Man_t *, SimpSolver &)");
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig2( Gia_Man_t * p, SimpSolver& S ) 
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
        if ( !glucose_solver_addclause( &S, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    //printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    //Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}